

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

String * kj::_::generateExtensionResponse
                   (String *__return_storage_ptr__,CompressionParameters *parameters)

{
  bool bVar1;
  unsigned_long **ppuVar2;
  String *pSVar3;
  char (*in_RCX) [29];
  char (*in_RDX) [19];
  unsigned_long *in_R8;
  String local_f0;
  unsigned_long *local_d8;
  Fault local_d0;
  unsigned_long *local_c8;
  unsigned_long *_kj_result_1;
  unsigned_long w_1;
  String local_b0;
  unsigned_long *local_98;
  Fault local_90;
  unsigned_long *local_88;
  unsigned_long *_kj_result;
  unsigned_long w;
  String local_70;
  String local_48;
  undefined1 local_30 [8];
  String response;
  CompressionParameters *parameters_local;
  
  response.content.disposer = (ArrayDisposer *)parameters;
  str<char_const(&)[19]>((String *)local_30,(kj *)0x93fd7a,in_RDX);
  if (((ulong)(response.content.disposer)->_vptr_ArrayDisposer & 0x100) != 0) {
    str<kj::String&,char_const(&)[29]>(&local_48,(kj *)local_30,(String *)0x94045e,in_RCX);
    String::operator=((String *)local_30,&local_48);
    String::~String(&local_48);
  }
  if (((ulong)(response.content.disposer)->_vptr_ArrayDisposer & 1) != 0) {
    str<kj::String&,char_const(&)[29]>(&local_70,(kj *)local_30,(String *)0x93f475,in_RCX);
    String::operator=((String *)local_30,&local_70);
    String::~String(&local_70);
  }
  bVar1 = Maybe<unsigned_long>::operator==((Maybe<unsigned_long> *)(response.content.disposer + 3));
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    local_88 = readMaybe<unsigned_long>((Maybe<unsigned_long> *)(response.content.disposer + 3));
    if (local_88 == (unsigned_long *)0x0) {
      Debug::Fault::Fault(&local_90,
                          "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                          ,0x147e,FAILED,"parameters.inboundMaxWindowBits != nullptr","");
      Debug::Fault::fatal(&local_90);
    }
    ppuVar2 = mv<unsigned_long_const*>(&local_88);
    local_98 = *ppuVar2;
    _kj_result = (unsigned_long *)*local_98;
    str<kj::String&,char_const(&)[26],unsigned_long&>
              (&local_b0,(kj *)local_30,(String *)"; client_max_window_bits=",
               (char (*) [26])&_kj_result,in_R8);
    String::operator=((String *)local_30,&local_b0);
    String::~String(&local_b0);
  }
  bVar1 = Maybe<unsigned_long>::operator==((Maybe<unsigned_long> *)(response.content.disposer + 1));
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    local_c8 = readMaybe<unsigned_long>((Maybe<unsigned_long> *)(response.content.disposer + 1));
    if (local_c8 == (unsigned_long *)0x0) {
      Debug::Fault::Fault(&local_d0,
                          "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                          ,0x1482,FAILED,"parameters.outboundMaxWindowBits != nullptr","");
      Debug::Fault::fatal(&local_d0);
    }
    ppuVar2 = mv<unsigned_long_const*>(&local_c8);
    local_d8 = *ppuVar2;
    _kj_result_1 = (unsigned_long *)*local_d8;
    str<kj::String&,char_const(&)[26],unsigned_long&>
              (&local_f0,(kj *)local_30,(String *)"; server_max_window_bits=",
               (char (*) [26])&_kj_result_1,in_R8);
    String::operator=((String *)local_30,&local_f0);
    String::~String(&local_f0);
  }
  pSVar3 = mv<kj::String>((String *)local_30);
  String::String(__return_storage_ptr__,pSVar3);
  String::~String((String *)local_30);
  return __return_storage_ptr__;
}

Assistant:

kj::String generateExtensionResponse(const CompressionParameters& parameters) {
  // Build the `Sec-WebSocket-Extensions` response from the agreed parameters.
  kj::String response = kj::str("permessage-deflate");
  if (parameters.inboundNoContextTakeover) {
    response = kj::str(response, "; client_no_context_takeover");
  }
  if (parameters.outboundNoContextTakeover) {
    response = kj::str(response, "; server_no_context_takeover");
  }
  if (parameters.inboundMaxWindowBits != kj::none) {
    auto w = KJ_REQUIRE_NONNULL(parameters.inboundMaxWindowBits);
    response = kj::str(response, "; client_max_window_bits=", w);
  }
  if (parameters.outboundMaxWindowBits != kj::none) {
    auto w = KJ_REQUIRE_NONNULL(parameters.outboundMaxWindowBits);
    response = kj::str(response, "; server_max_window_bits=", w);
  }
  return kj::mv(response);
}